

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  undefined4 extraout_var;
  int64 iVar2;
  undefined1 local_98 [8];
  ArrayOutputStream array_stream;
  CodedOutputStream o;
  
  io::ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_98,output->ptr,0x7fffffff,-1);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)&array_stream.position_,(ZeroCopyOutputStream *)local_98,true);
  iVar1 = (*msg->_vptr_MessageLite[0xc])(msg,o.impl_._56_8_,&array_stream.position_);
  iVar2 = io::EpsCopyOutputStream::ByteCount
                    ((EpsCopyOutputStream *)&array_stream.position_,
                     (uint8 *)CONCAT44(extraout_var,iVar1));
  output->ptr = output->ptr + ((int)iVar2 - (int)o.cur_);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&array_stream.position_);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}